

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeFunctionArgumentsFinal
               (ExpressionContext *ctx,SynBase *source,ExprBase *value,
               ArrayView<FunctionValue> functions,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  SynShortFunctionDefinition *syntax;
  FunctionData *pFVar1;
  _func_int *p_Var2;
  TypeFunction *type;
  ExprBase *pEVar3;
  ExprBase *pEVar4;
  SynIdentifier *pSVar5;
  IntrusiveList<MatchData> aliases_00;
  int iVar6;
  uint size;
  FunctionValue *pFVar7;
  undefined4 extraout_var;
  ExprBase **ppEVar8;
  ExprError *this;
  TypeBase *pTVar9;
  ExprSequence *this_00;
  undefined4 extraout_var_02;
  ShortFunctionHandle *node;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TypeFunctionSet *pTVar10;
  undefined4 extraout_var_06;
  ArgumentData *pAVar11;
  uint k;
  uint index;
  bool bVar12;
  _func_int **pp_Var13;
  uint i;
  uint uVar14;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<ExprBase_*> arr;
  ArrayView<ArgumentData> currArguments;
  ArrayView<ArgumentData> currArguments_00;
  ExprBase *local_200;
  ArrayView<FunctionValue> functions_local;
  ExprBase *option;
  uint local_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [48];
  IntrusiveList<ShortFunctionHandle> overloads;
  undefined1 local_198 [12];
  undefined1 local_188 [12];
  undefined8 local_178;
  undefined8 uStack_170;
  IntrusiveList<MatchData> aliases;
  MatchData local_158 [4];
  Allocator *local_d8;
  SmallArray<ExprBase_*,_16U> options;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  functions_local.data = functions.data;
  functions_local.count = functions.count;
  size = 0;
  local_1d8._32_8_ = value;
  do {
    if (argumentHead == (SynCallArgument *)0x0) {
      return;
    }
    if ((functions_local.count == 0) && (argumentHead->name != (SynIdentifier *)0x0)) {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,source,"ERROR: function argument names are unknown at this point");
    }
    syntax = (SynShortFunctionDefinition *)argumentHead->value;
    if ((syntax != (SynShortFunctionDefinition *)0x0) && ((syntax->super_SynBase).typeID == 0x39)) {
      options.allocator = ctx->allocator;
      options.data = options.little;
      options.count = 0;
      options.max = 0x10;
      local_1d8._40_8_ = argumentHead;
      if (functions_local.count == 0) {
        pTVar9 = *(TypeBase **)(local_1d8._32_8_ + 0x18);
        ArrayView<ArgumentData>::ArrayView<16u>
                  ((ArrayView<ArgumentData> *)local_188,resultArguments,size);
        local_178 = 0;
        uStack_170 = 0;
        currArguments_00._12_4_ = 0;
        currArguments_00.data = (ArgumentData *)local_188._0_8_;
        currArguments_00.count = local_188._8_4_;
        aliases.head = (MatchData *)
                       AnalyzeShortFunctionDefinition
                                 (ctx,syntax,pTVar9,currArguments_00,
                                  (IntrusiveList<MatchData>)ZEXT816(0));
        if ((ExprBase *)aliases.head != (ExprBase *)0x0) {
          SmallArray<ExprBase_*,_16U>::push_back(&options,(ExprBase **)&aliases);
        }
      }
      else {
        for (uVar14 = 0; uVar14 < functions_local.count; uVar14 = uVar14 + 1) {
          aliases.head = (MatchData *)0x0;
          aliases.tail._0_4_ = 0;
          aliases.tail._4_4_ = 0;
          pFVar7 = ArrayView<FunctionValue>::operator[](&functions_local,uVar14);
          pFVar1 = pFVar7->function;
          if (pFVar1->scope->ownerType != (TypeBase *)0x0) {
            pFVar7 = ArrayView<FunctionValue>::operator[](&functions_local,uVar14);
            pTVar9 = pFVar7->context->type;
            if ((((pTVar9 != (TypeBase *)0x0) && (pTVar9->typeID == 0x12)) &&
                (pp_Var13 = pTVar9[1]._vptr_TypeBase, pp_Var13 != (_func_int **)0x0)) &&
               (*(int *)(pp_Var13 + 1) == 0x18)) {
              pp_Var13 = pp_Var13 + 0x1e;
              while (p_Var2 = *pp_Var13, p_Var2 != (_func_int *)0x0) {
                iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                MatchData::MatchData
                          ((MatchData *)CONCAT44(extraout_var,iVar6),*(SynIdentifier **)p_Var2,
                           *(TypeBase **)(p_Var2 + 8));
                IntrusiveList<MatchData>::push_back
                          (&aliases,(MatchData *)CONCAT44(extraout_var,iVar6));
                pp_Var13 = (_func_int **)(p_Var2 + 0x10);
              }
            }
          }
          type = pFVar1->type;
          ArrayView<ArgumentData>::ArrayView<16u>
                    ((ArrayView<ArgumentData> *)local_198,resultArguments,size);
          aliases_00.tail._4_4_ = aliases.tail._4_4_;
          aliases_00.tail._0_4_ = aliases.tail._0_4_;
          aliases_00.head = aliases.head;
          currArguments._12_4_ = 0;
          currArguments.data = (ArgumentData *)local_198._0_8_;
          currArguments.count = local_198._8_4_;
          option = AnalyzeShortFunctionDefinition
                             (ctx,syntax,&type->super_TypeBase,currArguments,aliases_00);
          if (option != (ExprBase *)0x0) {
            bVar12 = false;
            for (index = 0; index < options.count; index = index + 1) {
              ppEVar8 = SmallArray<ExprBase_*,_16U>::operator[](&options,index);
              bVar12 = (bool)(bVar12 | (*ppEVar8)->type == option->type);
            }
            if (!bVar12) {
              SmallArray<ExprBase_*,_16U>::push_back(&options,&option);
            }
          }
        }
      }
      if (options.count == 1) {
        ppEVar8 = SmallArray<ExprBase_*,_16U>::operator[](&options,0);
        this = (ExprError *)*ppEVar8;
      }
      else if (options.count == 0) {
        uVar14 = IntrusiveList<SynShortFunctionArgument>::size(&syntax->arguments);
        anon_unknown.dwarf_ff84f::Report
                  (ctx,source,
                   "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d"
                   ,(ulong)uVar14,(ulong)(size + 1));
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprError *)CONCAT44(extraout_var_00,iVar6);
        pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError(this,source,pTVar9);
      }
      else {
        local_d8 = ctx->allocator;
        aliases.head = local_158;
        aliases.tail._0_4_ = 0;
        aliases.tail._4_4_ = 0x10;
        overloads.head = (ShortFunctionHandle *)0x0;
        overloads.tail = (ShortFunctionHandle *)0x0;
        for (uVar14 = 0; uVar14 < options.count; uVar14 = uVar14 + 1) {
          ppEVar8 = SmallArray<ExprBase_*,_16U>::operator[](&options,uVar14);
          pEVar3 = *ppEVar8;
          if ((pEVar3 == (ExprBase *)0x0) || ((pEVar3->typeID & 0xfffffffe) != 0x24)) {
            __assert_fail("isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1cbb,
                          "void AnalyzeFunctionArgumentsFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, SynCallArgument *, SmallArray<ArgumentData, 16> &)"
                         );
          }
          SmallArray<TypeBase_*,_16U>::push_back
                    ((SmallArray<TypeBase_*,_16U> *)&aliases,&pEVar3->type);
          ppEVar8 = SmallArray<ExprBase_*,_16U>::operator[](&options,uVar14);
          pEVar4 = *ppEVar8;
          if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 0x24)) {
            if (pEVar3->typeID == 0x25) {
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
              this_00 = (ExprSequence *)CONCAT44(extraout_var_02,iVar6);
              pTVar9 = (TypeBase *)pEVar3[1]._vptr_ExprBase[6];
              (this_00->super_ExprBase).typeID = 9;
              (this_00->super_ExprBase).source = source;
              (this_00->super_ExprBase).type = pTVar9;
              (this_00->super_ExprBase).next = (ExprBase *)0x0;
              (this_00->super_ExprBase).listed = false;
              (this_00->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e35c8;
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              node = (ShortFunctionHandle *)CONCAT44(extraout_var_03,iVar6);
              goto LAB_001d3c48;
            }
          }
          else {
            if (*(long *)&pEVar4[2].typeID == 0) {
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
              this_00 = (ExprSequence *)CONCAT44(extraout_var_04,iVar6);
              pTVar9 = (TypeBase *)pEVar4[1]._vptr_ExprBase[6];
              (this_00->super_ExprBase).typeID = 9;
              (this_00->super_ExprBase).source = source;
              (this_00->super_ExprBase).type = pTVar9;
              (this_00->super_ExprBase).next = (ExprBase *)0x0;
              (this_00->super_ExprBase).listed = false;
              (this_00->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e35c8;
            }
            else {
              local_1d8._24_8_ = ctx->allocator;
              option = (ExprBase *)local_1d8;
              local_1e0 = 0;
              uStack_1dc = 3;
              local_200 = pEVar4;
              SmallArray<ExprBase_*,_3U>::push_back
                        ((SmallArray<ExprBase_*,_3U> *)&option,&local_200);
              if (*(ExprBase **)&pEVar4[2].typeID != (ExprBase *)0x0) {
                local_200 = *(ExprBase **)&pEVar4[2].typeID;
                SmallArray<ExprBase_*,_3U>::push_back
                          ((SmallArray<ExprBase_*,_3U> *)&option,&local_200);
              }
              if ((VariableData *)pEVar4[2].source != (VariableData *)0x0) {
                local_200 = CreateVariableAccess(ctx,source,(VariableData *)pEVar4[2].source,true);
                SmallArray<ExprBase_*,_3U>::push_back
                          ((SmallArray<ExprBase_*,_3U> *)&option,&local_200);
              }
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
              this_00 = (ExprSequence *)CONCAT44(extraout_var_01,iVar6);
              arr.count = local_1e0;
              arr.data = (ExprBase **)option;
              arr._12_4_ = 0;
              ExprSequence::ExprSequence
                        (this_00,ctx->allocator,source,(TypeBase *)pEVar4[1]._vptr_ExprBase[6],arr);
              SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)&option);
            }
            iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            node = (ShortFunctionHandle *)CONCAT44(extraout_var_05,iVar6);
            pEVar3 = pEVar4;
LAB_001d3c48:
            node->function = (FunctionData *)pEVar3[1]._vptr_ExprBase;
            node->context = &this_00->super_ExprBase;
            node->next = (ShortFunctionHandle *)0x0;
            node->listed = false;
            IntrusiveList<ShortFunctionHandle>::push_back(&overloads,node);
          }
        }
        setTypes.count = aliases.tail._0_4_;
        setTypes.data = (TypeBase **)aliases.head;
        setTypes._12_4_ = 0;
        pTVar10 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this = (ExprError *)CONCAT44(extraout_var_06,iVar6);
        (this->super_ExprBase).typeID = 0x28;
        (this->super_ExprBase).source = source;
        (this->super_ExprBase).type = &pTVar10->super_TypeBase;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3ad0;
        (this->values).data = (ExprBase **)overloads.head;
        *(ShortFunctionHandle **)&(this->values).count = overloads.tail;
        SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)&aliases);
      }
      argumentHead = (SynCallArgument *)local_1d8._40_8_;
      pSVar5 = *(SynIdentifier **)(local_1d8._40_8_ + 0x40);
      pTVar9 = (this->super_ExprBase).type;
      pAVar11 = SmallArray<ArgumentData,_16U>::operator[](resultArguments,size);
      pAVar11->source = &argumentHead->super_SynBase;
      pAVar11->isExplicit = false;
      pAVar11->name = pSVar5;
      pAVar11->type = pTVar9;
      pAVar11->value = &this->super_ExprBase;
      pAVar11->valueFunction = (FunctionData *)0x0;
      SmallArray<ExprBase_*,_16U>::~SmallArray(&options);
    }
    size = size + 1;
    argumentHead = (SynCallArgument *)(argumentHead->super_SynBase).next;
    if ((argumentHead == (SynCallArgument *)0x0) || ((argumentHead->super_SynBase).typeID != 0x18))
    {
      argumentHead = (SynCallArgument *)0x0;
    }
  } while( true );
}

Assistant:

void AnalyzeFunctionArgumentsFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	unsigned pos = 0;

	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(functions.empty() && el->name)
			Stop(ctx, source, "ERROR: function argument names are unknown at this point");

		if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(el->value))
		{
			SmallArray<ExprBase*, 16> options(ctx.allocator);

			if(functions.empty())
			{
				if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, value->type, ArrayView<ArgumentData>(resultArguments, pos), IntrusiveList<MatchData>()))
					options.push_back(option);
			}
			else
			{
				for(unsigned i = 0; i < functions.size(); i++)
				{
					IntrusiveList<MatchData> aliases;

					FunctionData *function = functions[i].function;

					if(function->scope->ownerType)
					{
						if(TypeRef *contextType = getType<TypeRef>(functions[i].context->type))
						{
							if(TypeClass *classType = getType<TypeClass>(contextType->subType))
							{
								for(MatchData *el = classType->generics.head; el; el = el->next)
									aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
							}
						}
					}

					if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, function->type, ArrayView<ArgumentData>(resultArguments, pos), aliases))
					{
						bool found = false;

						for(unsigned k = 0; k < options.size(); k++)
						{
							if(options[k]->type == option->type)
								found = true;
						}

						if(!found)
							options.push_back(option);
					}
				}
			}

			ExprBase *argument = NULL;

			if(options.empty())
			{
				Report(ctx, source, "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d", node->arguments.size(), pos + 1);

				argument = new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}
			else if(options.size() == 1)
			{
				argument = options[0];
			}
			else
			{
				SmallArray<TypeBase*, 16> types(ctx.allocator);

				IntrusiveList<ShortFunctionHandle> overloads;

				for(unsigned i = 0; i < options.size(); i++)
				{
					ExprBase *option = options[i];

					assert(isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option));

					types.push_back(option->type);

					if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(options[i]))
					{
						ExprBase *context = NULL;

						if(node->contextVariableDefinition)
						{
							SmallArray<ExprBase*, 3> expressions(ctx.allocator);

							expressions.push_back(node);

							if(node->contextVariableDefinition)
								expressions.push_back(node->contextVariableDefinition);

							if(node->contextVariable)
								expressions.push_back(CreateVariableAccess(ctx, source, node->contextVariable, true));

							context = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, node->function->contextType, expressions);
						}
						else
						{
							context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);
						}

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
					else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(option))
					{
						ExprBase *context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
				}

				TypeFunctionSet *type = ctx.GetFunctionSetType(types);

				argument = new (ctx.get<ExprShortFunctionOverloadSet>()) ExprShortFunctionOverloadSet(source, type, overloads);
			}

			resultArguments[pos++] = ArgumentData(el, false, el->name, argument->type, argument);
		}
		else
		{
			pos++;
		}
	}
}